

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

void __thiscall
Fl_Help_View::hv_draw(Fl_Help_View *this,char *t,int x,int y,int entity_extra_length)

{
  Fl_Color FVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  uint uVar8;
  double dVar9;
  double extraout_XMM0_Qa;
  
  if ((((selected == 0) || (current_view != this)) || (selection_last <= current_pos)) ||
     (current_pos < selection_first)) {
    fl_draw(t,x,y);
  }
  else {
    FVar1 = fl_graphics_driver->color_;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
              (fl_graphics_driver,(ulong)hv_selection_color);
    dVar9 = fl_width(t);
    iVar2 = current_pos;
    uVar8 = (uint)dVar9;
    sVar7 = strlen(t);
    if ((int)sVar7 + iVar2 < selection_last) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x38])(fl_graphics_driver,0x20);
      uVar8 = uVar8 + (int)extraout_XMM0_Qa;
    }
    iVar2 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
    iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
    uVar4 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(uint)x,(ulong)(uint)((iVar2 + y) - iVar3),(ulong)uVar8,
               (ulong)uVar4);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
              (fl_graphics_driver,(ulong)hv_selection_text_color);
    fl_draw(t,x,y);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,FVar1);
  }
  if (draw_mode != 0) {
    dVar9 = fl_width(t);
    iVar2 = mouse_y;
    if ((x <= mouse_x) && (mouse_x < (int)dVar9 + x)) {
      iVar5 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
      iVar6 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
      iVar3 = mouse_y;
      if (iVar6 + (y - iVar5) <= iVar2) {
        iVar5 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
        iVar2 = current_pos;
        if (iVar3 <= iVar5 + y) {
          sVar7 = strlen(t);
          iVar3 = (int)sVar7 + iVar2;
          if (draw_mode == 1) {
            selection_push_first = iVar2;
            selection_push_last = iVar3;
          }
          else {
            selection_drag_first = iVar2;
            selection_drag_last = iVar3 + entity_extra_length;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Fl_Help_View::hv_draw(const char *t, int x, int y, int entity_extra_length)
{
  if (selected && current_view==this && current_pos<selection_last && current_pos>=selection_first) {
    Fl_Color c = fl_color();
    fl_color(hv_selection_color);
    int w = (int)fl_width(t);
    if (current_pos+(int)strlen(t)<selection_last)
      w += (int)fl_width(' ');
    fl_rectf(x, y+fl_descent()-fl_height(), w, fl_height());
    fl_color(hv_selection_text_color);
    fl_draw(t, x, y);
    fl_color(c);
  } else {
    fl_draw(t, x, y);
  }
  if (draw_mode) {
    int w = (int)fl_width(t);
    if (mouse_x>=x && mouse_x<x+w) {
      if (mouse_y>=y-fl_height()+fl_descent()&&mouse_y<=y+fl_descent()) {
        int f = (int) current_pos;
        int l = (int) (f+strlen(t)); // use 'quote_char' to calculate the true length of the HTML string
        if (draw_mode==1) {
          selection_push_first = f;
          selection_push_last = l;
        } else {
          selection_drag_first = f;
          selection_drag_last = l + entity_extra_length;
        }
      }
    }
  }
}